

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::parse_from_stream(App *this,istream *input)

{
  if (this->parsed_ == 0) {
    _validate(this);
    _configure(this);
  }
  _parse_stream(this,input);
  run_callback(this,false,false);
  return;
}

Assistant:

CLI11_INLINE void App::parse_from_stream(std::istream &input) {
    if(parsed_ == 0) {
        _validate();
        _configure();
        // set the parent as nullptr as this object should be the top now
    }

    _parse_stream(input);
    run_callback();
}